

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_entry.cc
# Opt level: O3

list_entry * raptor_list_pop_back(list_entry *head)

{
  list_entry *plVar1;
  list_entry *plVar2;
  
  if (head->next != head) {
    plVar1 = head->prev;
    plVar2 = plVar1->prev;
    plVar2->next = head;
    head->prev = plVar2;
    return plVar1;
  }
  return (list_entry *)0x0;
}

Assistant:

list_entry* raptor_list_pop_back(list_entry* head) {
    list_entry* second = 0;
    list_entry* removed = 0;
    if (RAPTOR_LIST_IS_EMPTY(head)) {
        return 0;
    }

    removed = head->prev;
    second = removed->prev;

    second->next = head;
    head->prev = second;
    return removed;
}